

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::WriteRuleHashes(cmGlobalGenerator *this,string *pfile)

{
  bool bVar1;
  char *name;
  pointer ppVar2;
  ostream *poVar3;
  iterator local_290;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
  local_288;
  iterator local_280;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
  local_278;
  const_iterator rhi;
  undefined1 local_260 [8];
  cmGeneratedFileStream fout;
  string *pfile_local;
  cmGlobalGenerator *this_local;
  
  fout._576_8_ = pfile;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
          ::empty(&this->RuleHashes);
  if (bVar1) {
    cmsys::SystemTools::RemoveFile((string *)fout._576_8_);
  }
  else {
    name = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_260,name,false);
    std::operator<<((ostream *)local_260,"# Hashes of file build rules.\n");
    local_280._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
         ::begin(&this->RuleHashes);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
    ::_Rb_tree_const_iterator(&local_278,&local_280);
    while( true ) {
      local_290._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
           ::end(&this->RuleHashes);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
      ::_Rb_tree_const_iterator(&local_288,&local_290);
      bVar1 = std::operator!=(&local_278,&local_288);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
               ::operator->(&local_278);
      std::ostream::write(local_260,(long)&ppVar2->second);
      poVar3 = std::operator<<((ostream *)local_260," ");
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
               ::operator->(&local_278);
      poVar3 = std::operator<<(poVar3,(string *)ppVar2);
      std::operator<<(poVar3,"\n");
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
      ::operator++(&local_278);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_260);
  }
  return;
}

Assistant:

void cmGlobalGenerator::WriteRuleHashes(std::string const& pfile)
{
  // Now generate a new persistence file with the current hashes.
  if(this->RuleHashes.empty())
    {
    cmSystemTools::RemoveFile(pfile);
    }
  else
    {
    cmGeneratedFileStream fout(pfile.c_str());
    fout << "# Hashes of file build rules.\n";
    for(std::map<std::string, RuleHash>::const_iterator
          rhi = this->RuleHashes.begin(); rhi != this->RuleHashes.end(); ++rhi)
      {
      fout.write(rhi->second.Data, 32);
      fout << " " << rhi->first << "\n";
      }
    }
}